

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::setPreviewWidget(QColumnViewPrivate *this,QWidget *widget)

{
  bool bVar1;
  QAbstractItemView **ppQVar2;
  QWidget *parent;
  QWidget *in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QColumnViewPreviewColumn *column;
  QColumnView *q;
  QList<QAbstractItemView_*> *in_stack_ffffffffffffffa8;
  SelectionMode mode;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffb8;
  ScrollBarPolicy policy;
  QAbstractScrollArea *in_stack_ffffffffffffffc0;
  QWidget *this_00;
  int local_10;
  int local_c;
  long local_8;
  
  policy = (ScrollBarPolicy)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->previewColumn != (QAbstractItemView *)0x0) {
    bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x864c07);
    if (!bVar1) {
      ppQVar2 = QList<QAbstractItemView_*>::constLast(in_stack_ffffffffffffffa8);
      if (*ppQVar2 == in_RDI->previewColumn) {
        QList<QAbstractItemView_*>::removeLast
                  ((QList<QAbstractItemView_*> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
    }
    QObject::deleteLater();
  }
  parent = (QWidget *)operator_new(0x30);
  QColumnViewPreviewColumn::QColumnViewPreviewColumn
            ((QColumnViewPreviewColumn *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),parent);
  this_00 = parent;
  QColumnViewPreviewColumn::setPreviewWidget
            ((QColumnViewPreviewColumn *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),parent);
  mode = (SelectionMode)((ulong)parent >> 0x20);
  in_RDI->previewColumn = (QAbstractItemView *)this_00;
  QWidget::hide((QWidget *)0x864c9f);
  uVar3 = 0;
  QFrame::setFrameShape(&in_stack_ffffffffffffffc0->super_QFrame,policy);
  QAbstractScrollArea::setVerticalScrollBarPolicy(in_stack_ffffffffffffffc0,policy);
  QAbstractItemView::setSelectionMode
            ((QAbstractItemView *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),mode);
  QAbstractScrollArea::verticalScrollBar
            ((QAbstractScrollArea *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  local_c = QWidget::width((QWidget *)0x864cff);
  local_10 = QWidget::minimumWidth((QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  qMax<int>(&local_c,&local_10);
  QWidget::setMinimumWidth(this_00,(int)((ulong)in_RDI >> 0x20));
  in_RDI->previewWidget = in_RSI;
  QAbstractScrollArea::viewport((QAbstractScrollArea *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  QWidget::setParent(this_00,(QWidget *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::setPreviewWidget(QWidget *widget)
{
    Q_Q(QColumnView);
    if (previewColumn) {
        if (!columns.isEmpty() && columns.constLast() == previewColumn)
            columns.removeLast();
        previewColumn->deleteLater();
    }
    QColumnViewPreviewColumn *column = new QColumnViewPreviewColumn(q);
    column->setPreviewWidget(widget);
    previewColumn = column;
    previewColumn->hide();
    previewColumn->setFrameShape(QFrame::NoFrame);
    previewColumn->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    previewColumn->setSelectionMode(QAbstractItemView::NoSelection);
    previewColumn->setMinimumWidth(qMax(previewColumn->verticalScrollBar()->width(),
                previewColumn->minimumWidth()));
    previewWidget = widget;
    previewWidget->setParent(previewColumn->viewport());
}